

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

Branch * __thiscall
soul::PoolAllocator::allocate<soul::heart::Branch,soul::pool_ref<soul::heart::Block>&>
          (PoolAllocator *this,pool_ref<soul::heart::Block> *args)

{
  UTF8Reader *this_00;
  Block *b;
  SourceCodeText *pSVar1;
  _lambda_void___1_ local_29;
  Branch *local_28;
  Branch *newObject;
  PoolItem *newItem;
  pool_ref<soul::heart::Block> *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args;
  args_local = (pool_ref<soul::heart::Block> *)this;
  newObject = (Branch *)allocateSpaceForObject(this,0x58);
  this_00 = &(newObject->super_Terminator).super_Object.location.location;
  b = pool_ref::operator_cast_to_Block_((pool_ref *)newItem);
  heart::Branch::Branch((Branch *)this_00,b);
  local_28 = (Branch *)this_00;
  pSVar1 = (SourceCodeText *)
           allocate(soul::pool_ref&)::{lambda(void*)#1}::operator_cast_to_function_pointer
                     (&local_29);
  (newObject->super_Terminator).super_Object.location.sourceCode.object = pSVar1;
  return local_28;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }